

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall tinyusdz::Stage::allocate_prim_id(Stage *this,uint64_t *prim_id)

{
  bool bVar1;
  uint64_t val;
  uint64_t local_10;
  
  if (prim_id != (uint64_t *)0x0) {
    bVar1 = HandleAllocator<unsigned_long>::Allocate(&this->_prim_id_allocator,&local_10);
    if (bVar1) {
      *prim_id = local_10;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Stage::allocate_prim_id(uint64_t *prim_id) const {
  if (!prim_id) {
    return false;
  }

  uint64_t val;
  if (_prim_id_allocator.Allocate(&val)) {
    (*prim_id) = val;
    return true;
  }

  return false;
}